

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gptgen.cpp
# Opt level: O0

int read_mbr(string *drive,uint64_t lba,int block_size,char *buf)

{
  string local_58;
  int local_34;
  char *pcStack_30;
  int ret;
  char *tmpbuf;
  char *buf_local;
  uint64_t uStack_18;
  int block_size_local;
  uint64_t lba_local;
  string *drive_local;
  
  tmpbuf = buf;
  buf_local._4_4_ = block_size;
  uStack_18 = lba;
  lba_local = (uint64_t)drive;
  pcStack_30 = (char *)operator_new__((long)block_size);
  std::__cxx11::string::string((string *)&local_58,(string *)drive);
  local_34 = read_block(&local_58,uStack_18,buf_local._4_4_,pcStack_30);
  std::__cxx11::string::~string((string *)&local_58);
  if (-1 < local_34) {
    memcpy(tmpbuf,pcStack_30,0x1be);
  }
  if (pcStack_30 != (char *)0x0) {
    operator_delete__(pcStack_30);
  }
  return local_34;
}

Assistant:

int read_mbr(string drive, uint64_t lba, int block_size, char *buf)
{
	char *tmpbuf = new char[block_size];
	int ret;

	ret = read_block(drive, lba, block_size, tmpbuf);
	if (ret >= 0) memcpy(buf, tmpbuf, 446);
	delete [] tmpbuf;
	return ret;
}